

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib666.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  short sVar4;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  undefined1 auVar5 [16];
  short sVar14;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  short sVar15;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  short sVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  long lVar39;
  undefined1 auVar40 [16];
  long lVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  undefined1 auVar57 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  long local_98;
  long lStack_90;
  long local_88;
  long lStack_80;
  long local_78;
  long lStack_70;
  long local_68;
  long lStack_60;
  long local_58;
  long lStack_50;
  long local_48;
  long lStack_40;
  long local_38;
  long lStack_30;
  
  lVar39 = 6;
  lVar41 = 7;
  lVar2 = 0xf;
  auVar7 = _DAT_00102030;
  auVar36 = _DAT_00102060;
  auVar31 = _DAT_00102040;
  auVar6 = _DAT_00102050;
  auVar37 = _DAT_00102090;
  auVar38 = _DAT_001020a0;
  auVar47 = _DAT_00102080;
  auVar46 = _DAT_00102010;
  auVar45 = _DAT_00102020;
  do {
    auVar16 = auVar36 ^ _DAT_001020b0;
    auVar43._0_4_ = -(uint)(auVar16._0_4_ < -0x7fffbd98);
    auVar43._4_4_ = -(uint)(auVar16._0_4_ < -0x7fffbd98);
    auVar43._8_4_ = -(uint)(auVar16._8_4_ < -0x7fffbd98);
    auVar43._12_4_ = -(uint)(auVar16._8_4_ < -0x7fffbd98);
    auVar35._0_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar35._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar35._8_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar35._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar35 = auVar35 & auVar43;
    auVar16 = auVar6 ^ _DAT_001020b0;
    auVar66._0_4_ = -(uint)(auVar16._0_4_ < -0x7fffbd98);
    auVar66._4_4_ = -(uint)(auVar16._0_4_ < -0x7fffbd98);
    auVar66._8_4_ = -(uint)(auVar16._8_4_ < -0x7fffbd98);
    auVar66._12_4_ = -(uint)(auVar16._8_4_ < -0x7fffbd98);
    auVar17._0_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar17._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar17._8_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar17._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar17 = auVar17 & auVar66;
    auVar65 = packssdw(auVar35,auVar17);
    auVar16 = auVar31 ^ _DAT_001020b0;
    auVar26._0_4_ = -(uint)(auVar16._0_4_ < -0x7fffbd98);
    auVar26._4_4_ = -(uint)(auVar16._0_4_ < -0x7fffbd98);
    auVar26._8_4_ = -(uint)(auVar16._8_4_ < -0x7fffbd98);
    auVar26._12_4_ = -(uint)(auVar16._8_4_ < -0x7fffbd98);
    auVar32._0_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar32._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar32._8_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar32._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar32 = auVar32 & auVar26;
    auVar16 = auVar7 ^ _DAT_001020b0;
    auVar27._0_4_ = -(uint)(auVar16._0_4_ < -0x7fffbd98);
    auVar27._4_4_ = -(uint)(auVar16._0_4_ < -0x7fffbd98);
    auVar27._8_4_ = -(uint)(auVar16._8_4_ < -0x7fffbd98);
    auVar27._12_4_ = -(uint)(auVar16._8_4_ < -0x7fffbd98);
    auVar5._0_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar5._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar5._8_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar5._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar5 = auVar5 & auVar27;
    auVar16 = packssdw(auVar32,auVar5);
    auVar66 = packssdw(auVar65,auVar16);
    auVar16 = auVar38 ^ _DAT_001020b0;
    auVar28._0_4_ = -(uint)(auVar16._0_4_ < -0x7fffbd98);
    auVar28._4_4_ = -(uint)(auVar16._0_4_ < -0x7fffbd98);
    auVar28._8_4_ = -(uint)(auVar16._8_4_ < -0x7fffbd98);
    auVar28._12_4_ = -(uint)(auVar16._8_4_ < -0x7fffbd98);
    auVar34._0_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar34._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar34._8_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar34._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar34 = auVar34 & auVar28;
    auVar16 = auVar37 ^ _DAT_001020b0;
    auVar29._0_4_ = -(uint)(auVar16._0_4_ < -0x7fffbd98);
    auVar29._4_4_ = -(uint)(auVar16._0_4_ < -0x7fffbd98);
    auVar29._8_4_ = -(uint)(auVar16._8_4_ < -0x7fffbd98);
    auVar29._12_4_ = -(uint)(auVar16._8_4_ < -0x7fffbd98);
    auVar33._0_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar33._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar33._8_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar33._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar33 = auVar33 & auVar29;
    auVar65 = packssdw(auVar34,auVar33);
    auVar16 = auVar47 ^ _DAT_001020b0;
    auVar42._0_4_ = -(uint)(auVar16._0_4_ < -0x7fffbd98);
    auVar42._4_4_ = -(uint)(auVar16._0_4_ < -0x7fffbd98);
    auVar42._8_4_ = -(uint)(auVar16._8_4_ < -0x7fffbd98);
    auVar42._12_4_ = -(uint)(auVar16._8_4_ < -0x7fffbd98);
    auVar30._0_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar30._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar30._8_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar30._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar30 = auVar30 & auVar42;
    auVar16._8_8_ = lVar41;
    auVar16._0_8_ = lVar39;
    auVar16 = auVar16 ^ _DAT_001020b0;
    auVar40._0_4_ = -(uint)(auVar16._0_4_ < -0x7fffbd98);
    auVar40._4_4_ = -(uint)(auVar16._0_4_ < -0x7fffbd98);
    auVar40._8_4_ = -(uint)(auVar16._8_4_ < -0x7fffbd98);
    auVar40._12_4_ = -(uint)(auVar16._8_4_ < -0x7fffbd98);
    auVar25._0_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar25._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar25._8_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar25._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar25 = auVar25 & auVar40;
    auVar16 = packssdw(auVar30,auVar25);
    auVar16 = packssdw(auVar65,auVar16);
    auVar43 = pmulhuw(auVar45,_DAT_001020d0);
    sVar15 = auVar45._0_2_;
    sVar18 = auVar45._2_2_;
    sVar19 = auVar45._4_2_;
    sVar20 = auVar45._6_2_;
    sVar21 = auVar45._8_2_;
    sVar22 = auVar45._10_2_;
    sVar23 = auVar45._12_2_;
    sVar24 = auVar45._14_2_;
    auVar44 = pmulhuw(auVar46,_DAT_001020d0);
    sVar4 = auVar46._0_2_;
    sVar8 = auVar46._2_2_;
    sVar9 = auVar46._4_2_;
    sVar10 = auVar46._6_2_;
    sVar11 = auVar46._8_2_;
    sVar12 = auVar46._10_2_;
    sVar13 = auVar46._12_2_;
    sVar14 = auVar46._14_2_;
    auVar65._0_2_ = -(ushort)((ushort)(sVar4 + (auVar44._0_2_ >> 3) * -0x4d) == 0x4c);
    auVar65._2_2_ = -(ushort)((ushort)(sVar8 + (auVar44._2_2_ >> 3) * -0x4d) == 0x4c);
    auVar65._4_2_ = -(ushort)((ushort)(sVar9 + (auVar44._4_2_ >> 3) * -0x4d) == 0x4c);
    auVar65._6_2_ = -(ushort)((ushort)(sVar10 + (auVar44._6_2_ >> 3) * -0x4d) == 0x4c);
    auVar65._8_2_ = -(ushort)((ushort)(sVar11 + (auVar44._8_2_ >> 3) * -0x4d) == 0x4c);
    auVar65._10_2_ = -(ushort)((ushort)(sVar12 + (auVar44._10_2_ >> 3) * -0x4d) == 0x4c);
    auVar65._12_2_ = -(ushort)((ushort)(sVar13 + (auVar44._12_2_ >> 3) * -0x4d) == 0x4c);
    auVar65._14_2_ = -(ushort)((ushort)(sVar14 + (auVar44._14_2_ >> 3) * -0x4d) == 0x4c);
    auVar45 = pmulhuw(auVar45,_DAT_00102100);
    sVar56 = sVar15 + (auVar45._0_2_ >> 3) * -0x1a;
    sVar58 = sVar18 + (auVar45._2_2_ >> 3) * -0x1a;
    sVar59 = sVar19 + (auVar45._4_2_ >> 3) * -0x1a;
    sVar60 = sVar20 + (auVar45._6_2_ >> 3) * -0x1a;
    sVar61 = sVar21 + (auVar45._8_2_ >> 3) * -0x1a;
    sVar62 = sVar22 + (auVar45._10_2_ >> 3) * -0x1a;
    sVar63 = sVar23 + (auVar45._12_2_ >> 3) * -0x1a;
    sVar64 = sVar24 + (auVar45._14_2_ >> 3) * -0x1a;
    auVar46 = pmulhuw(auVar46,_DAT_00102100);
    sVar48 = sVar4 + (auVar46._0_2_ >> 3) * -0x1a;
    sVar49 = sVar8 + (auVar46._2_2_ >> 3) * -0x1a;
    sVar50 = sVar9 + (auVar46._4_2_ >> 3) * -0x1a;
    sVar51 = sVar10 + (auVar46._6_2_ >> 3) * -0x1a;
    sVar52 = sVar11 + (auVar46._8_2_ >> 3) * -0x1a;
    sVar53 = sVar12 + (auVar46._10_2_ >> 3) * -0x1a;
    sVar54 = sVar13 + (auVar46._12_2_ >> 3) * -0x1a;
    sVar55 = sVar14 + (auVar46._14_2_ >> 3) * -0x1a;
    auVar44._0_2_ = -(ushort)((ushort)(sVar15 + (auVar43._0_2_ >> 3) * -0x4d) == 0x4c);
    auVar44._2_2_ = -(ushort)((ushort)(sVar18 + (auVar43._2_2_ >> 3) * -0x4d) == 0x4c);
    auVar44._4_2_ = -(ushort)((ushort)(sVar19 + (auVar43._4_2_ >> 3) * -0x4d) == 0x4c);
    auVar44._6_2_ = -(ushort)((ushort)(sVar20 + (auVar43._6_2_ >> 3) * -0x4d) == 0x4c);
    auVar44._8_2_ = -(ushort)((ushort)(sVar21 + (auVar43._8_2_ >> 3) * -0x4d) == 0x4c);
    auVar44._10_2_ = -(ushort)((ushort)(sVar22 + (auVar43._10_2_ >> 3) * -0x4d) == 0x4c);
    auVar44._12_2_ = -(ushort)((ushort)(sVar23 + (auVar43._12_2_ >> 3) * -0x4d) == 0x4c);
    auVar44._14_2_ = -(ushort)((ushort)(sVar24 + (auVar43._14_2_ >> 3) * -0x4d) == 0x4c);
    auVar57[0] = ((0 < sVar56) * (sVar56 < 0x100) * (char)sVar56 - (0xff < sVar56)) + 'A';
    auVar57[1] = ((0 < sVar58) * (sVar58 < 0x100) * (char)sVar58 - (0xff < sVar58)) + 'A';
    auVar57[2] = ((0 < sVar59) * (sVar59 < 0x100) * (char)sVar59 - (0xff < sVar59)) + 'A';
    auVar57[3] = ((0 < sVar60) * (sVar60 < 0x100) * (char)sVar60 - (0xff < sVar60)) + 'A';
    auVar57[4] = ((0 < sVar61) * (sVar61 < 0x100) * (char)sVar61 - (0xff < sVar61)) + 'A';
    auVar57[5] = ((0 < sVar62) * (sVar62 < 0x100) * (char)sVar62 - (0xff < sVar62)) + 'A';
    auVar57[6] = ((0 < sVar63) * (sVar63 < 0x100) * (char)sVar63 - (0xff < sVar63)) + 'A';
    auVar57[7] = ((0 < sVar64) * (sVar64 < 0x100) * (char)sVar64 - (0xff < sVar64)) + 'A';
    auVar57[8] = ((0 < sVar48) * (sVar48 < 0x100) * (char)sVar48 - (0xff < sVar48)) + 'A';
    auVar57[9] = ((0 < sVar49) * (sVar49 < 0x100) * (char)sVar49 - (0xff < sVar49)) + 'A';
    auVar57[10] = ((0 < sVar50) * (sVar50 < 0x100) * (char)sVar50 - (0xff < sVar50)) + 'A';
    auVar57[0xb] = ((0 < sVar51) * (sVar51 < 0x100) * (char)sVar51 - (0xff < sVar51)) + 'A';
    auVar57[0xc] = ((0 < sVar52) * (sVar52 < 0x100) * (char)sVar52 - (0xff < sVar52)) + 'A';
    auVar57[0xd] = ((0 < sVar53) * (sVar53 < 0x100) * (char)sVar53 - (0xff < sVar53)) + 'A';
    auVar57[0xe] = ((0 < sVar54) * (sVar54 < 0x100) * (char)sVar54 - (0xff < sVar54)) + 'A';
    auVar57[0xf] = ((0 < sVar55) * (sVar55 < 0x100) * (char)sVar55 - (0xff < sVar55)) + 'A';
    auVar46 = packsswb(auVar44 & auVar16,auVar65 & auVar66);
    auVar45 = auVar46 & _DAT_00102130 | ~auVar46 & auVar57;
    if ((auVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(char *)(lVar2 + 0x1040c1) = auVar45[0];
    }
    auVar16 = packssdw(auVar34,auVar34);
    auVar16 = packssdw(auVar16,auVar16);
    auVar16 = packsswb(auVar16,auVar16);
    if ((auVar16._0_4_ >> 8 & 1) != 0) {
      *(char *)(lVar2 + 0x1040c2) = auVar45[1];
    }
    auVar46 = packssdw(~auVar46 & auVar57,auVar33);
    auVar46 = packssdw(auVar46,auVar46);
    auVar46 = packsswb(auVar46,auVar46);
    local_58 = auVar6._0_8_;
    lStack_50 = auVar6._8_8_;
    local_78 = auVar47._0_8_;
    lStack_70 = auVar47._8_8_;
    local_88 = auVar37._0_8_;
    lStack_80 = auVar37._8_8_;
    if ((auVar46._0_4_ >> 0x10 & 1) != 0) {
      *(char *)(lVar2 + 0x1040c3) = auVar45[2];
    }
    auVar6 = pshufhw(auVar46,auVar33,0x84);
    auVar6 = packssdw(auVar6,auVar6);
    auVar6 = packsswb(auVar6,auVar6);
    if ((auVar6._0_4_ >> 0x18 & 1) != 0) {
      *(char *)(lVar2 + 0x1040c4) = auVar45[3];
    }
    auVar6 = pshuflw(auVar6,auVar30,0xe8);
    auVar6 = packssdw(auVar6,auVar6);
    auVar6 = packsswb(auVar6,auVar6);
    local_48 = auVar31._0_8_;
    lStack_40 = auVar31._8_8_;
    if ((auVar6 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(char *)(lVar2 + 0x1040c5) = auVar45[4];
    }
    auVar31 = packssdw(auVar30,auVar30);
    auVar31 = packssdw(auVar6,auVar31);
    auVar31 = packsswb(auVar31,auVar31);
    if ((auVar31._4_2_ >> 8 & 1) != 0) {
      *(char *)(lVar2 + 0x1040c6) = auVar45[5];
    }
    auVar31 = packssdw(auVar31,auVar25);
    auVar31 = packssdw(auVar31,auVar31);
    auVar31 = packsswb(auVar31,auVar31);
    local_98 = auVar38._0_8_;
    lStack_90 = auVar38._8_8_;
    if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(char *)(lVar2 + 0x1040c7) = auVar45[6];
    }
    auVar31 = pshufhw(auVar31,auVar25,0x84);
    auVar31 = packssdw(auVar31,auVar31);
    auVar31 = packsswb(auVar31,auVar31);
    if ((auVar31._6_2_ >> 8 & 1) != 0) {
      *(char *)(lVar2 + 0x1040c8) = auVar45[7];
    }
    auVar31 = pshuflw(auVar31,auVar35,0xe8);
    auVar31 = packssdw(auVar31,auVar31);
    auVar31 = packsswb(auVar31,auVar31);
    local_68 = auVar36._0_8_;
    lStack_60 = auVar36._8_8_;
    if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(char *)(lVar2 + 0x1040c9) = auVar45[8];
    }
    auVar36 = packssdw(auVar35,auVar35);
    auVar36 = packssdw(auVar36,auVar36);
    auVar36 = packsswb(auVar31,auVar36);
    if ((auVar36._8_2_ >> 8 & 1) != 0) {
      *(char *)(lVar2 + 0x1040ca) = auVar45[9];
    }
    auVar36 = packssdw(auVar36,auVar17);
    auVar36 = packssdw(auVar36,auVar36);
    auVar36 = packsswb(auVar36,auVar36);
    if ((auVar36 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      *(char *)(lVar2 + 0x1040cb) = auVar45[10];
    }
    auVar36 = pshufhw(auVar36,auVar17,0x84);
    auVar36 = packssdw(auVar36,auVar36);
    auVar36 = packsswb(auVar36,auVar36);
    if ((auVar36._10_2_ >> 8 & 1) != 0) {
      *(char *)(lVar2 + 0x1040cc) = auVar45[0xb];
    }
    auVar36 = pshuflw(auVar36,auVar32,0xe8);
    auVar36 = packssdw(auVar36,auVar36);
    auVar36 = packsswb(auVar36,auVar36);
    if ((auVar36 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(char *)(lVar2 + 0x1040cd) = auVar45[0xc];
    }
    auVar31 = packssdw(auVar32,auVar32);
    auVar36 = packssdw(auVar36,auVar31);
    auVar36 = packsswb(auVar36,auVar36);
    if ((auVar36._12_2_ >> 8 & 1) != 0) {
      *(char *)(lVar2 + 0x1040ce) = auVar45[0xd];
    }
    auVar36 = packssdw(auVar36,auVar5);
    auVar36 = packssdw(auVar36,auVar36);
    auVar36 = packsswb(auVar36,auVar36);
    if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(char *)(lVar2 + 0x1040cf) = auVar45[0xe];
    }
    auVar36 = pshufhw(auVar36,auVar5,0x84);
    auVar36 = packssdw(auVar36,auVar36);
    auVar36 = packsswb(auVar36,auVar36);
    if ((auVar36._14_2_ >> 8 & 1) != 0) {
      buffer[lVar2] = auVar45[0xf];
    }
    auVar38._0_8_ = local_98 + 0x10;
    auVar38._8_8_ = lStack_90 + 0x10;
    auVar37._0_8_ = local_88 + 0x10;
    auVar37._8_8_ = lStack_80 + 0x10;
    auVar47._0_8_ = local_78 + 0x10;
    auVar47._8_8_ = lStack_70 + 0x10;
    lVar39 = lVar39 + 0x10;
    lVar41 = lVar41 + 0x10;
    auVar36._0_8_ = local_68 + 0x10;
    auVar36._8_8_ = lStack_60 + 0x10;
    auVar6._0_8_ = local_58 + 0x10;
    auVar6._8_8_ = lStack_50 + 0x10;
    auVar31._0_8_ = local_48 + 0x10;
    auVar31._8_8_ = lStack_40 + 0x10;
    local_38 = auVar7._0_8_;
    lStack_30 = auVar7._8_8_;
    auVar7._0_8_ = local_38 + 0x10;
    auVar7._8_8_ = lStack_30 + 0x10;
    auVar45._0_2_ = sVar15 + (short)DAT_00102150;
    auVar45._2_2_ = sVar18 + DAT_00102150._2_2_;
    auVar45._4_2_ = sVar19 + DAT_00102150._4_2_;
    auVar45._6_2_ = sVar20 + DAT_00102150._6_2_;
    auVar45._8_2_ = sVar21 + DAT_00102150._8_2_;
    auVar45._10_2_ = sVar22 + DAT_00102150._10_2_;
    auVar45._12_2_ = sVar23 + DAT_00102150._12_2_;
    auVar45._14_2_ = sVar24 + DAT_00102150._14_2_;
    auVar46._0_2_ = sVar4 + (short)DAT_00102150;
    auVar46._2_2_ = sVar8 + DAT_00102150._2_2_;
    auVar46._4_2_ = sVar9 + DAT_00102150._4_2_;
    auVar46._6_2_ = sVar10 + DAT_00102150._6_2_;
    auVar46._8_2_ = sVar11 + DAT_00102150._8_2_;
    auVar46._10_2_ = sVar12 + DAT_00102150._10_2_;
    auVar46._12_2_ = sVar13 + DAT_00102150._12_2_;
    auVar46._14_2_ = sVar14 + DAT_00102150._14_2_;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x427f);
  iVar1 = curl_global_init(3);
  if (iVar1 != 0) {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    return 0x7e;
  }
  lVar2 = curl_easy_init();
  if (lVar2 == 0) {
    pcVar3 = "curl_easy_init() failed\n";
LAB_001018c5:
    lVar39 = 0;
  }
  else {
    lVar39 = curl_mime_init(lVar2);
    if (lVar39 == 0) {
      pcVar3 = "curl_mime_init() failed\n";
      goto LAB_001018c5;
    }
    lVar41 = curl_mime_addpart(lVar39);
    if (lVar41 != 0) {
      iVar1 = curl_mime_name(lVar41,"upfile");
      if (iVar1 == 0) {
        iVar1 = curl_mime_filename(lVar41,"myfile.txt");
        if (iVar1 == 0) {
          iVar1 = curl_mime_data(lVar41,buffer,17000);
          if (iVar1 == 0) {
            iVar1 = curl_mime_encoder(lVar41,"binary");
            if (iVar1 == 0) {
              iVar1 = curl_easy_setopt(lVar2,0x2712,URL);
              if ((((iVar1 == 0) && (iVar1 = curl_easy_setopt(lVar2,0x281d,lVar39), iVar1 == 0)) &&
                  (iVar1 = curl_easy_setopt(lVar2,0x118,0x401b), iVar1 == 0)) &&
                 ((iVar1 = curl_easy_setopt(lVar2,0x29,1), iVar1 == 0 &&
                  (iVar1 = curl_easy_setopt(lVar2,0x2a,1), iVar1 == 0)))) {
                iVar1 = curl_easy_perform(lVar2);
              }
              goto LAB_0010196e;
            }
            pcVar3 = "curl_mime_encoder() failed\n";
          }
          else {
            pcVar3 = "curl_mime_data() failed\n";
          }
        }
        else {
          pcVar3 = "curl_mime_filename() failed\n";
        }
      }
      else {
        pcVar3 = "curl_mime_name() failed\n";
      }
      curl_mfprintf(_stderr,pcVar3);
      goto LAB_0010196e;
    }
    pcVar3 = "curl_mime_addpart() failed\n";
  }
  curl_mfprintf(_stderr,pcVar3);
  iVar1 = 0x7e;
LAB_0010196e:
  curl_easy_cleanup(lVar2);
  curl_mime_free(lVar39);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *curl = NULL;
  CURLcode res = CURLE_OK;
  curl_mime *mime = NULL;
  curl_mimepart *part;
  size_t i;

  /* Checks huge binary-encoded mime post. */

  /* Create a buffer with pseudo-binary data. */
  for(i = 0; i < sizeof(buffer); i++)
    if(i % 77 == 76)
      buffer[i] = '\n';
    else
      buffer[i] = (char) (0x41 + i % 26); /* A...Z */

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    res = (CURLcode) TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }

  /* Build mime structure. */
  mime = curl_mime_init(curl);
  if(!mime) {
    fprintf(stderr, "curl_mime_init() failed\n");
    res = (CURLcode) TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  part = curl_mime_addpart(mime);
  if(!part) {
    fprintf(stderr, "curl_mime_addpart() failed\n");
    res = (CURLcode) TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  res = curl_mime_name(part, "upfile");
  if(res) {
    fprintf(stderr, "curl_mime_name() failed\n");
    goto test_cleanup;
  }
  res = curl_mime_filename(part, "myfile.txt");
  if(res) {
    fprintf(stderr, "curl_mime_filename() failed\n");
    goto test_cleanup;
  }
  res = curl_mime_data(part, buffer, sizeof(buffer));
  if(res) {
    fprintf(stderr, "curl_mime_data() failed\n");
    goto test_cleanup;
  }
  res = curl_mime_encoder(part, "binary");
  if(res) {
    fprintf(stderr, "curl_mime_encoder() failed\n");
    goto test_cleanup;
  }

  /* First set the URL that is about to receive our mime mail. */
  test_setopt(curl, CURLOPT_URL, URL);

  /* Post form */
  test_setopt(curl, CURLOPT_MIMEPOST, mime);

  /* Shorten upload buffer. */
  test_setopt(curl, CURLOPT_UPLOAD_BUFFERSIZE, 16411L);

  /* get verbose debug output please */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* include headers in the output */
  test_setopt(curl, CURLOPT_HEADER, 1L);

  /* Perform the request, res will get the return code */
  res = curl_easy_perform(curl);

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);

  /* now cleanup the mime structure */
  curl_mime_free(mime);

  curl_global_cleanup();

  return res;
}